

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_0::BaseTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseTestInstance *this)

{
  ProgramCollection<vk::ProgramBinary> *this_00;
  Handle<(vk::HandleType)24> HVar1;
  deUint32 queueFamilyIndex;
  DeviceInterface *deviceInterface;
  VkDevice device;
  ProgramBinary *binary;
  VkDescriptorSetLayout descriptorSetLayout;
  int iVar2;
  char *__s;
  int iVar3;
  ulong uVar4;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_108;
  string local_e8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_c8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_a8;
  VkQueue local_80;
  IVec3 workSize;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_58;
  undefined4 extraout_var;
  
  (*(this->super_TestInstance)._vptr_TestInstance[9])(this);
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_80 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  __s = "comp_fmt_unknown";
  if (this->m_declareImageFormatInShader != false) {
    __s = "comp";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,__s,(allocator<char> *)&local_c8);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_a8,deviceInterface,device,binary,0);
  local_58.m_data.deleter.m_device = local_a8.m_data.deleter.m_device;
  local_58.m_data.deleter.m_allocator = local_a8.m_data.deleter.m_allocator;
  local_58.m_data.object.m_internal = local_a8.m_data.object.m_internal;
  local_58.m_data.deleter.m_deviceIface = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  descriptorSetLayout.m_internal._0_4_ = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  descriptorSetLayout.m_internal._4_4_ = extraout_var;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_e8,deviceInterface,device,
                     descriptorSetLayout);
  local_a8.m_data.deleter.m_device = (VkDevice)local_e8.field_2._M_allocated_capacity;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_e8.field_2._8_8_;
  local_a8.m_data.object.m_internal = (deUint64)local_e8._M_dataplus._M_p;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_e8._M_string_length;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_e8);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&local_c8,deviceInterface,device,
                      (VkPipelineLayout)local_a8.m_data.object.m_internal,
                      (VkShaderModule)local_58.m_data.object.m_internal);
  local_e8.field_2._M_allocated_capacity = (size_type)local_c8.m_data.deleter.m_device;
  local_e8.field_2._8_8_ = local_c8.m_data.deleter.m_allocator;
  local_e8._M_dataplus._M_p = (pointer)local_c8.m_data.object.m_internal;
  local_e8._M_string_length = (size_type)local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_c8);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_108,deviceInterface,device,1,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_c8.m_data.deleter.m_device = local_108.m_data.deleter.m_device;
  local_c8.m_data.deleter.m_allocator = local_108.m_data.deleter.m_allocator;
  local_c8.m_data.object.m_internal = local_108.m_data.object.m_internal;
  local_c8.m_data.deleter.m_deviceIface = local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_108);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&workSize,deviceInterface,device,
             (VkCommandPool)local_c8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_108.m_data.object.m_internal._0_4_ = workSize.m_data[0];
  local_108.m_data.object.m_internal._4_4_ = workSize.m_data[1];
  local_108.m_data.deleter.m_deviceIface = stack0xffffffffffffff90;
  workSize.m_data[0] = 0;
  workSize.m_data[1] = 0;
  stack0xffffffffffffff90 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&workSize);
  HVar1.m_internal = local_108.m_data.object.m_internal;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_108.m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,HVar1.m_internal,1,local_e8._M_dataplus._M_p);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this,local_108.m_data.object.m_internal);
  if (this->m_singleLayerBind == true) {
    tcu::Vector<int,_3>::Vector(&workSize,&(this->m_texture).m_layerSize);
  }
  else {
    Texture::size((Texture *)&workSize);
  }
  iVar3 = (this->m_texture).m_numLayers;
  uVar4 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar2 = 1;
  if (this->m_singleLayerBind != false) {
    iVar2 = iVar3;
  }
  while( true ) {
    iVar3 = (int)uVar4;
    if (iVar2 == iVar3) break;
    (*(this->super_TestInstance)._vptr_TestInstance[8])
              (this,local_108.m_data.object.m_internal,local_a8.m_data.object.m_internal,uVar4);
    if (iVar3 != 0) {
      (*(this->super_TestInstance)._vptr_TestInstance[6])(this,local_108.m_data.object.m_internal);
    }
    (*deviceInterface->_vptr_DeviceInterface[0x5d])
              (deviceInterface,local_108.m_data.object.m_internal,workSize.m_data._0_8_ & 0xffffffff
               ,(ulong)workSize.m_data._0_8_ >> 0x20,(ulong)stack0xffffffffffffff90 & 0xffffffff);
    uVar4 = (ulong)(iVar3 + 1);
  }
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,local_108.m_data.object.m_internal);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)local_108.m_data.object.m_internal);
  submitCommandsAndWait
            (deviceInterface,device,local_80,(VkCommandBuffer)local_108.m_data.object.m_internal);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(__return_storage_ptr__,this);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseTestInstance::iterate (void)
{
	checkRequirements();

	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					device				= m_context.getDevice();
	const VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_declareImageFormatInShader ? "comp" : "comp_fmt_unknown"), 0));

	const VkDescriptorSetLayout descriptorSetLayout = prepareDescriptors();
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(createCommandPool(vk, device, VK_COMMAND_POOL_RESET_RELEASE_RESOURCES_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	commandBeforeCompute(*cmdBuffer);

	const tcu::IVec3 workSize = (m_singleLayerBind ? m_texture.layerSize() : m_texture.size());
	const int loopNumLayers = (m_singleLayerBind ? m_texture.numLayers() : 1);
	for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
	{
		commandBindDescriptorsForLayer(*cmdBuffer, *pipelineLayout, layerNdx);

		if (layerNdx > 0)
			commandBetweenShaderInvocations(*cmdBuffer);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
	}

	commandAfterCompute(*cmdBuffer);

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return verifyResult();
}